

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O2

bool __thiscall cmCursesStringWidget::PrintKeys(cmCursesStringWidget *this)

{
  int iVar1;
  char fmt_s [3];
  undefined2 local_1c;
  undefined1 local_1a;
  
  if (((_stdscr != 0) && (4 < *(short *)(_stdscr + 4) && 0x3f < *(short *)(_stdscr + 6))) &&
     ((this->super_cmCursesWidget).field_0x3c == '\x01')) {
    iVar1 = (int)*(short *)(_stdscr + 4);
    local_1a = 0;
    local_1c = 0x7325;
    move(iVar1 + -3,0);
    wclrtoeol(_stdscr);
    move(iVar1 + -2,0);
    printw(&local_1c,"Editing option, press [enter] to confirm");
    wclrtoeol(_stdscr);
    move(iVar1 + -1,0);
    printw(&local_1c,"                press [esc] to cancel");
    wclrtoeol(_stdscr);
    move(iVar1,0);
    wclrtoeol(_stdscr);
    return true;
  }
  return false;
}

Assistant:

bool cmCursesStringWidget::PrintKeys()
{
  int x;
  int y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
    return false;
  }
  if (this->InEdit) {
    char fmt_s[] = "%s";
    // Clean the toolbar
    curses_move(y - 4, 0);
    clrtoeol();
    curses_move(y - 3, 0);
    printw(fmt_s, "Editing option, press [enter] to confirm");
    clrtoeol();
    curses_move(y - 2, 0);
    printw(fmt_s, "                press [esc] to cancel");
    clrtoeol();
    curses_move(y - 1, 0);
    clrtoeol();

    return true;
  }
  return false;
}